

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

size_t Output::TraceStats(Phase phase,char16 *form,...)

{
  char in_AL;
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  size_t ret_val;
  va_list argptr;
  char16 *form_local;
  size_t sStack_10;
  Phase phase_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  argptr[0].reg_save_area = form;
  bVar1 = Js::Phases::IsEnabled((Phases *)(Js::Configuration::Global + 0x205a0),phase);
  if (bVar1) {
    argptr[0].overflow_arg_area = local_f8;
    argptr[0]._0_8_ = &stack0x00000008;
    ret_val._4_4_ = 0x30;
    ret_val._0_4_ = 0x10;
    sStack_10 = VPrint((char16 *)argptr[0].reg_save_area,(__va_list_tag *)&ret_val);
  }
  else {
    sStack_10 = 0;
  }
  return sStack_10;
}

Assistant:

size_t __cdecl
Output::TraceStats(Js::Phase phase, const char16 *form, ...)
{
    if(PHASE_STATS1(phase))
    {
        va_list argptr;
        va_start(argptr, form);
        size_t ret_val = Output::VPrint(form, argptr);
        va_end(argptr);
        return ret_val;
    }
    return 0;
}